

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# settings.c
# Opt level: O1

void write_clip_setting(settings_w *sesskey,char *savekey,Conf *conf,int confkey,int strconfkey)

{
  int iVar1;
  char *pcVar2;
  
  iVar1 = conf_get_int(conf,confkey);
  if (iVar1 == 1) {
    pcVar2 = "implicit";
  }
  else if (iVar1 == 2) {
    pcVar2 = "explicit";
  }
  else {
    if (iVar1 == 3) {
      pcVar2 = conf_get_str(conf,strconfkey);
      pcVar2 = dupcat_fn("custom:",pcVar2,0);
      write_setting_s(sesskey,savekey,pcVar2);
      safefree(pcVar2);
      return;
    }
    pcVar2 = "none";
  }
  write_setting_s(sesskey,savekey,pcVar2);
  return;
}

Assistant:

static void write_clip_setting(settings_w *sesskey, const char *savekey,
                               Conf *conf, int confkey, int strconfkey)
{
    int val = conf_get_int(conf, confkey);
    switch (val) {
      case CLIPUI_NONE:
      default:
        write_setting_s(sesskey, savekey, "none");
        break;
      case CLIPUI_IMPLICIT:
        write_setting_s(sesskey, savekey, "implicit");
        break;
      case CLIPUI_EXPLICIT:
        write_setting_s(sesskey, savekey, "explicit");
        break;
      case CLIPUI_CUSTOM: {
        char *sval = dupcat("custom:", conf_get_str(conf, strconfkey));
        write_setting_s(sesskey, savekey, sval);
        sfree(sval);
        break;
      }
    }
}